

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O0

bool __thiscall
AlternativeLoader::altValidateContinentLine
          (AlternativeLoader *this,int *continentCount,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lineWords,int *lineCount,bool *validMap,bool verbose)

{
  size_type sVar1;
  ostream *poVar2;
  bool verbose_local;
  bool *validMap_local;
  int *lineCount_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lineWords_local;
  int *continentCount_local;
  AlternativeLoader *this_local;
  
  *continentCount = *continentCount + 1;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(lineWords);
  if (sVar1 < 2) {
    if (verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*lineCount);
      std::operator<<(poVar2,
                      " - [ERROR] : a line in the continents declaration had missing tokens, map could not be created.\n"
                     );
    }
    *validMap = false;
    this_local._7_1_ = false;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(lineWords);
    if (sVar1 < 3) {
      this_local._7_1_ = true;
    }
    else {
      if (verbose) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Line ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*lineCount);
        std::operator<<(poVar2,
                        " - [WARNING] : a line in  the continents declaration had extra tokens.\n");
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AlternativeLoader::altValidateContinentLine(int *continentCount, std::vector<std::string> *lineWords, const int *lineCount,
                                            bool *validMap,bool verbose) {
    (*continentCount)++;
    //check validity of the line in this mode
    if (lineWords->size() < 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [ERROR] : a line in the continents declaration had missing tokens, map could not be created.\n";
        }
        *validMap = false;
        return false;
    } else if (lineWords->size() > 2) {
        if(verbose){
            std::cout << "Line " << *lineCount
                      << " - [WARNING] : a line in  the continents declaration had extra tokens.\n";
        }
        return true;
    } else {
        return true;
    }
}